

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

ON_Outline * __thiscall ON_OutlineAccumulator::Internal_Outline(ON_OutlineAccumulator *this)

{
  uint uVar1;
  ON_2dex OVar2;
  ON_2dex OVar3;
  ON_2dex OVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint *puVar10;
  
  if (*(long *)(this + 0x50) == 0) {
    puVar10 = (uint *)operator_new(0x78);
    puVar10[0x18] = 0;
    puVar10[0x19] = 0;
    puVar10[0x1a] = 0;
    puVar10[0x1b] = 0;
    puVar10[0x14] = 0;
    puVar10[0x15] = 0;
    puVar10[0x16] = 0;
    puVar10[0x17] = 0;
    puVar10[0x10] = 0;
    puVar10[0x11] = 0;
    puVar10[0x12] = 0;
    puVar10[0x13] = 0;
    puVar10[0xc] = 0;
    puVar10[0xd] = 0;
    puVar10[0xe] = 0;
    puVar10[0xf] = 0;
    puVar10[8] = 0;
    puVar10[9] = 0;
    puVar10[10] = 0;
    puVar10[0xb] = 0;
    puVar10[4] = 0;
    puVar10[5] = 0;
    puVar10[6] = 0;
    puVar10[7] = 0;
    puVar10[0] = 0;
    puVar10[1] = 0;
    puVar10[2] = 0;
    puVar10[3] = 0;
    puVar10[0x1c] = 0;
    dVar9 = ON_BoundingBox::NanBoundingBox.m_max.z;
    dVar8 = ON_BoundingBox::NanBoundingBox.m_max.x;
    dVar7 = ON_BoundingBox::NanBoundingBox.m_min.z;
    dVar6 = ON_BoundingBox::NanBoundingBox.m_min.y;
    dVar5 = ON_BoundingBox::NanBoundingBox.m_min.x;
    puVar10[0x1d] = 0;
    *(double *)(puVar10 + 0xc) = ON_BoundingBox::NanBoundingBox.m_max.y;
    *(double *)(puVar10 + 0xe) = dVar9;
    *(double *)(puVar10 + 8) = dVar7;
    *(double *)(puVar10 + 10) = dVar8;
    *(double *)(puVar10 + 4) = dVar5;
    *(double *)(puVar10 + 6) = dVar6;
    OVar4 = ON_TextBox::Unset.m_advance;
    OVar3 = ON_TextBox::Unset.m_max_basepoint;
    OVar2 = ON_TextBox::Unset.m_bbmax;
    *(ON_2dex *)(puVar10 + 0x10) = ON_TextBox::Unset.m_bbmin;
    *(ON_2dex *)(puVar10 + 0x12) = OVar2;
    *(ON_2dex *)(puVar10 + 0x14) = OVar3;
    *(ON_2dex *)(puVar10 + 0x16) = OVar4;
    *(undefined ***)(puVar10 + 0x18) = &PTR__ON_ClassArray_0081ec10;
    puVar10[0x1a] = 0;
    puVar10[0x1b] = 0;
    puVar10[0x1c] = 0;
    puVar10[0x1d] = 0;
    *(uint **)(this + 0x50) = puVar10;
    uVar1 = *(uint *)this;
    *puVar10 = uVar1;
    if (uVar1 != 0) {
      *(double *)(puVar10 + 2) = (double)uVar1 / 2056.0;
    }
  }
  return *(ON_Outline **)(this + 0x50);
}

Assistant:

ON_Outline& ON_OutlineAccumulator::Internal_Outline()
{
  if (nullptr == m_outline)
  {
    m_outline = new ON_Outline();
    m_outline->SetUnitsPerEM(m_units_per_em);
  }
  return *m_outline;
}